

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O2

void __thiscall BamTools::HeaderTool::~HeaderTool(HeaderTool *this)

{
  HeaderSettings *this_00;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__HeaderTool_001f2088;
  this_00 = this->m_settings;
  if (this_00 != (HeaderSettings *)0x0) {
    HeaderSettings::~HeaderSettings(this_00);
  }
  operator_delete(this_00);
  this->m_settings = (HeaderSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (HeaderToolPrivate *)0x0;
  return;
}

Assistant:

HeaderTool::~HeaderTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}